

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O3

bool __thiscall rw::Animation::streamWriteLegacy(Animation *this,Stream *stream)

{
  void *pvVar1;
  long lVar2;
  void *data;
  
  Stream::writeI32(stream,this->numFrames);
  Stream::writeI32(stream,this->flags);
  Stream::writeF32(stream,this->duration);
  if (0 < this->numFrames) {
    pvVar1 = this->keyframes;
    data = (void *)((long)pvVar1 + 0x1c);
    lVar2 = 0;
    do {
      *(ulong *)((long)data + -0x10) = *(ulong *)((long)data + -0x10) ^ 0x8000000080000000;
      *(ulong *)((long)data + -8) = *(ulong *)((long)data + -8) ^ 0x80000000;
      Stream::write32(stream,(void *)((long)data + -0x10),0x10);
      *(ulong *)((long)data + -0x10) = *(ulong *)((long)data + -0x10) ^ 0x8000000080000000;
      *(ulong *)((long)data + -8) = *(ulong *)((long)data + -8) ^ 0x80000000;
      Stream::write32(stream,data,0xc);
      Stream::writeF32(stream,*(float32 *)((long)data + -0x14));
      Stream::writeI32(stream,(int)((ulong)(*(long *)((long)data + -0x1c) - (long)pvVar1) >> 3) *
                              -0x3333332c);
      lVar2 = lVar2 + 1;
      data = (void *)((long)data + 0x28);
    } while (lVar2 < this->numFrames);
  }
  return true;
}

Assistant:

bool
Animation::streamWriteLegacy(Stream *stream)
{
	stream->writeI32(this->numFrames);
	stream->writeI32(this->flags);
	stream->writeF32(this->duration);
	assert(interpInfo->id == 1);
	HAnimKeyFrame *frames = (HAnimKeyFrame*)this->keyframes;
	for(int32 i = 0; i < this->numFrames; i++){
		frames[i].q = conj(frames[i].q);
		stream->write32(&frames[i].q, 4*4);
		frames[i].q = conj(frames[i].q);
		stream->write32(&frames[i].t, 3*4);
		stream->writeF32(frames[i].time);
		stream->writeI32((frames[i].prev - frames)*0x24);
	}
	return true;
}